

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>
::TestInfo::TestInfo
          (TestInfo *this,char *a_test_suite_base_name,char *a_test_base_name,
          TestMetaFactoryBase<std::tuple<int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*)>_>
          *a_test_meta_factory,CodeLocation *a_code_location)

{
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)this,a_test_suite_base_name,&local_29);
  std::__cxx11::string::string((string *)&this->test_base_name,a_test_base_name,&local_2a);
  (this->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*)>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*)>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*)>_>_*,_false>
  ._M_head_impl = a_test_meta_factory;
  CodeLocation::CodeLocation(&this->code_location,a_code_location);
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}